

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O2

void __thiscall
btConnectivityProcessor::processTriangle
          (btConnectivityProcessor *this,btVector3 *triangle,int partId,int triangleIndex)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  btTriangleInfo *pbVar4;
  btVector3 *pbVar5;
  int j;
  uint uVar6;
  long lVar7;
  int iVar8;
  btTriangleInfoMap *pbVar9;
  long lVar10;
  int i;
  long lVar11;
  btScalar bVar12;
  float fVar13;
  btVector3 bVar14;
  btScalar local_1ec;
  btVector3 normalB;
  int local_1d8 [4];
  undefined8 local_1c8;
  undefined4 local_1c0;
  btVector3 local_1b8;
  btVector3 local_1a8;
  btVector3 normalA;
  btVector3 edge;
  btQuaternion orn;
  btVector3 calculatedNormalA;
  btVector3 calculatedEdge;
  btTriangleShape tA;
  btTriangleShape tB;
  
  if ((this->m_partIdA != partId) || (this->m_triangleIndexA != triangleIndex)) {
    local_1d8[2] = 0xffffffff;
    local_1d8[0] = -1;
    local_1d8[1] = -1;
    local_1c0 = 0xffffffff;
    local_1c8 = 0xffffffffffffffff;
    tB.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._0_16_ = operator-(triangle + 1,triangle);
    edge = operator-(triangle + 2,triangle);
    tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._0_16_ = btVector3::cross((btVector3 *)&tB,&edge);
    bVar12 = btVector3::length2((btVector3 *)&tA);
    if (this->m_triangleInfoMap->m_equalVertexThreshold <= bVar12) {
      tB.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
      super_btCollisionShape._0_16_ =
           operator-(this->m_triangleVerticesA + 1,this->m_triangleVerticesA);
      edge = operator-(this->m_triangleVerticesA + 2,this->m_triangleVerticesA);
      tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
      super_btCollisionShape._0_16_ = btVector3::cross((btVector3 *)&tB,&edge);
      bVar12 = btVector3::length2((btVector3 *)&tA);
      pbVar9 = this->m_triangleInfoMap;
      if (pbVar9->m_equalVertexThreshold <= bVar12) {
        lVar11 = 0;
        iVar8 = 0;
        while (lVar11 != 3) {
          pbVar5 = triangle;
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape._0_16_ = operator-(this->m_triangleVerticesA + lVar11,pbVar5);
            bVar12 = btVector3::length2((btVector3 *)&tA);
            pbVar9 = this->m_triangleInfoMap;
            if (bVar12 < pbVar9->m_equalVertexThreshold) {
              local_1d8[iVar8] = (int)lVar11;
              *(int *)((long)&local_1c8 + (long)iVar8 * 4) = (int)lVar7;
              if (1 < iVar8) {
                return;
              }
              iVar8 = iVar8 + 1;
            }
            pbVar5 = pbVar5 + 1;
          }
          lVar11 = lVar11 + 1;
          if (2 < iVar8) {
            return;
          }
        }
        if (iVar8 == 2) {
          if ((local_1d8[0] == 0) && (local_1d8[1] == 2)) {
            local_1d8[0] = 2;
            local_1d8[1] = 0;
            local_1c8 = CONCAT44((int)local_1c8,(int)((ulong)local_1c8 >> 0x20));
          }
          uVar6 = this->m_partIdA << 0x15 | this->m_triangleIndexA;
          tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
          super_btCollisionShape._vptr_btCollisionShape._0_4_ = uVar6;
          pbVar4 = btHashMap<btHashInt,_btTriangleInfo>::find
                             (&pbVar9->super_btInternalTriangleInfoMap,(btHashInt *)&tA);
          if (pbVar4 == (btTriangleInfo *)0x0) {
            tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape._0_12_ = ZEXT812(0x40c90fdb40c90fdb) << 0x20;
            tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape._12_4_ = 0x40c90fdb;
            auVar3._12_4_ = 0;
            auVar3._0_12_ =
                 (undefined1  [12])
                 tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
                 super_btCollisionShape._4_12_;
            tA.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape._0_16_ = auVar3 << 0x20;
            tB.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape._vptr_btCollisionShape._0_4_ = uVar6;
            btHashMap<btHashInt,_btTriangleInfo>::insert
                      (&this->m_triangleInfoMap->super_btInternalTriangleInfoMap,(btHashInt *)&tB,
                       (btTriangleInfo *)&tA);
            tB.super_btPolyhedralConvexShape.super_btConvexInternalShape.super_btConvexShape.
            super_btCollisionShape._vptr_btCollisionShape._0_4_ = uVar6;
            pbVar4 = btHashMap<btHashInt,_btTriangleInfo>::find
                               (&this->m_triangleInfoMap->super_btInternalTriangleInfoMap,
                                (btHashInt *)&tB);
          }
          lVar10 = (long)local_1d8[0];
          lVar11 = (long)local_1d8[1];
          edge = operator-(this->m_triangleVerticesA + lVar11,this->m_triangleVerticesA + lVar10);
          pbVar5 = this->m_triangleVerticesA;
          btTriangleShape::btTriangleShape(&tA,pbVar5,pbVar5 + 1,pbVar5 + 2);
          lVar7 = (long)(int)local_1c8;
          iVar8 = (3 - local_1c8._4_4_) - (int)local_1c8;
          btTriangleShape::btTriangleShape
                    (&tB,triangle + local_1c8._4_4_,triangle + lVar7,triangle + iVar8);
          btTriangleShape::calcNormal(&tA,&normalA);
          btTriangleShape::calcNormal(&tB,&normalB);
          btVector3::normalize(&edge);
          local_1b8 = btVector3::cross(&edge,&normalA);
          pbVar5 = btVector3::normalize(&local_1b8);
          lVar11 = lVar11 + lVar10;
          local_1a8.m_floats._0_8_ = *(undefined8 *)pbVar5->m_floats;
          local_1a8.m_floats._8_8_ = *(undefined8 *)(pbVar5->m_floats + 2);
          bVar14 = operator-(this->m_triangleVerticesA + (3 - lVar11),
                             this->m_triangleVerticesA + lVar10);
          if (bVar14.m_floats[2] * local_1a8.m_floats[2] +
              bVar14.m_floats[0] * local_1a8.m_floats[0] +
              bVar14.m_floats[1] * local_1a8.m_floats[1] < 0.0) {
            local_1a8.m_floats._0_8_ = local_1a8.m_floats._0_8_ ^ 0x8000000080000000;
            local_1a8.m_floats._8_8_ = local_1a8.m_floats._8_8_ ^ 0x80000000;
          }
          calculatedEdge = btVector3::cross(&edge,&normalB);
          pbVar5 = btVector3::normalize(&calculatedEdge);
          local_1b8.m_floats = *&pbVar5->m_floats;
          bVar14 = operator-(triangle + iVar8,triangle + lVar7);
          if (bVar14.m_floats[2] * local_1b8.m_floats[2] +
              bVar14.m_floats[0] * local_1b8.m_floats[0] +
              bVar14.m_floats[1] * local_1b8.m_floats[1] < 0.0) {
            uVar1 = local_1b8.m_floats._0_8_ ^ 0x8000000080000000;
            local_1b8.m_floats[2] = -local_1b8.m_floats[2];
            local_1b8.m_floats[0] = (btScalar)(int)uVar1;
            local_1b8.m_floats[1] = (btScalar)(int)(uVar1 >> 0x20);
          }
          calculatedEdge = btVector3::cross(&local_1a8,&local_1b8);
          bVar12 = btVector3::length2(&calculatedEdge);
          if (this->m_triangleInfoMap->m_planarEpsilon <= bVar12) {
            btVector3::normalize(&calculatedEdge);
            calculatedNormalA = btVector3::cross(&calculatedEdge,&local_1a8);
            btVector3::normalize(&calculatedNormalA);
            bVar12 = btGetAngle(&calculatedNormalA,&local_1a8,&local_1b8);
            bVar12 = 3.1415927 - bVar12;
            fVar13 = normalA.m_floats[2] * local_1b8.m_floats[2] +
                     normalA.m_floats[0] * local_1b8.m_floats[0] +
                     normalA.m_floats[1] * local_1b8.m_floats[1];
            bVar2 = fVar13 < 0.0;
            if (0.0 <= fVar13) {
              bVar12 = -bVar12;
            }
          }
          else {
            bVar12 = 0.0;
            bVar2 = false;
          }
          iVar8 = (int)lVar11;
          if (iVar8 == 3) {
            calculatedNormalA =
                 operator-(this->m_triangleVerticesA + 1,this->m_triangleVerticesA + 2);
            local_1ec = -bVar12;
            btQuaternion::setRotation(&orn,&calculatedNormalA,&local_1ec);
            bVar14 = quatRotate(&orn,&normalA);
            if (bVar14.m_floats[2] * normalB.m_floats[2] +
                normalB.m_floats[0] * bVar14.m_floats[0] + bVar14.m_floats[1] * normalB.m_floats[1]
                < 0.0) {
              *(byte *)&pbVar4->m_flags = (byte)pbVar4->m_flags | 0x10;
            }
            pbVar4->m_edgeV1V2Angle = -bVar12;
            if (bVar2) {
              *(byte *)&pbVar4->m_flags = (byte)pbVar4->m_flags | 2;
            }
          }
          else if (iVar8 == 2) {
            calculatedNormalA = operator-(this->m_triangleVerticesA + 2,this->m_triangleVerticesA);
            local_1ec = -bVar12;
            btQuaternion::setRotation(&orn,&calculatedNormalA,&local_1ec);
            bVar14 = quatRotate(&orn,&normalA);
            if (bVar14.m_floats[2] * normalB.m_floats[2] +
                normalB.m_floats[0] * bVar14.m_floats[0] + bVar14.m_floats[1] * normalB.m_floats[1]
                < 0.0) {
              *(byte *)&pbVar4->m_flags = (byte)pbVar4->m_flags | 0x20;
            }
            pbVar4->m_edgeV2V0Angle = -bVar12;
            if (bVar2) {
              *(byte *)&pbVar4->m_flags = (byte)pbVar4->m_flags | 4;
            }
          }
          else if (iVar8 == 1) {
            calculatedNormalA = operator-(this->m_triangleVerticesA,this->m_triangleVerticesA + 1);
            local_1ec = -bVar12;
            btQuaternion::setRotation(&orn,&calculatedNormalA,&local_1ec);
            bVar14 = quatRotate(&orn,&normalA);
            if (bVar14.m_floats[2] * normalB.m_floats[2] +
                normalB.m_floats[0] * bVar14.m_floats[0] + bVar14.m_floats[1] * normalB.m_floats[1]
                < 0.0) {
              *(byte *)&pbVar4->m_flags = (byte)pbVar4->m_flags | 8;
            }
            pbVar4->m_edgeV0V1Angle = -bVar12;
            if (bVar2) {
              *(byte *)&pbVar4->m_flags = (byte)pbVar4->m_flags | 1;
            }
          }
          btPolyhedralConvexShape::~btPolyhedralConvexShape(&tB.super_btPolyhedralConvexShape);
          btPolyhedralConvexShape::~btPolyhedralConvexShape(&tA.super_btPolyhedralConvexShape);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3]={-1,-1,-1};
		int sharedVertsB[3]={-1,-1,-1};

		///skip degenerate triangles
		btScalar crossBSqr = ((triangle[1]-triangle[0]).cross(triangle[2]-triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;


		btScalar crossASqr = ((m_triangleVerticesA[1]-m_triangleVerticesA[0]).cross(m_triangleVerticesA[2]-m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr< m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i=0;i<3;i++)
		{
			for (int j=0;j<3;j++)
			{
				if ( (m_triangleVerticesA[i]-triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if(numshared >= 3)
						return;
				}
			}
			///degenerate case
			if(numshared >= 3)
				return;
		}
		switch (numshared)
		{
		case 0:
			{
				break;
			}
		case 1:
			{
				//shared vertex
				break;
			}
		case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = btGetHash(m_partIdA,m_triangleIndexA);

				btTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					btTriangleInfo tmp;
					m_triangleInfoMap->insert(hash,tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0]+sharedVertsA[1];
				int otherIndexA = 3-sumvertsA;

				
				btVector3 edge(m_triangleVerticesA[sharedVertsA[1]]-m_triangleVerticesA[sharedVertsA[0]]);

				btTriangleShape tA(m_triangleVerticesA[0],m_triangleVerticesA[1],m_triangleVerticesA[2]);
				int otherIndexB = 3-(sharedVertsB[0]+sharedVertsB[1]);

				btTriangleShape tB(triangle[sharedVertsB[1]],triangle[sharedVertsB[0]],triangle[otherIndexB]);
				//btTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				btVector3 normalA;
				btVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				btVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					btVector3 tmp = m_triangleVerticesA[otherIndexA]-m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA*=-1;
					}
				}

				btVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					btVector3 tmp = triangle[otherIndexB]-triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB*=-1;
					}
				}

				btScalar	angle2 = 0;
				btScalar	ang4 = 0.f;


				btVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				btScalar len2 = calculatedEdge.length2();

				btScalar correctedAngle(0);
				//btVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2<m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				} else
				{

					calculatedEdge.normalize();
					btVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = btGetAngle(calculatedNormalA,edgeCrossA,edgeCrossB);
					ang4 = SIMD_PI-angle2;
					btScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA<0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				

				
							
				//alternatively use 
				//btVector3 calculatedNormalB2 = quatRotate(orn,normalA);


				switch (sumvertsA)
				{
				case 1:
					{
						btVector3 edge = m_triangleVerticesA[0]-m_triangleVerticesA[1];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						btScalar bla = computedNormalB.dot(normalB);
						if (bla<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif//DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
				case 2:
					{
						btVector3 edge = m_triangleVerticesA[2]-m_triangleVerticesA[0];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							computedNormalB*=-1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;	
					}
				case 3:
					{
						btVector3 edge = m_triangleVerticesA[1]-m_triangleVerticesA[2];
						btQuaternion orn(edge,-correctedAngle);
						btVector3 computedNormalB = quatRotate(orn,normalA);
						if (computedNormalB.dot(normalB)<0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB*=-1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB-normalB).length()>0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
		default:
			{
				//				printf("warning: duplicate triangle\n");
			}

		}
	}